

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O2

bool __thiscall
pg::ZLKPPSolver::do_step
          (ZLKPPSolver *this,int max_priority,int prec_cur,int prec_opo,int *num_nodes_in_h,
          bool *reached_bottom_cur,bool *reached_bottom_opo)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> lose;
  vector<int,_std::allocator<int>_> top;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  *num_nodes_in_h = 0x7fffffff;
  if (this->cur_num_nodes != 0) {
    if (this->min_dominion <= prec_opo) {
      this->iterations = this->iterations + 1;
      get_nodes_of_max_priority(&top,this,max_priority);
      get_attractor(this,max_priority % 2,&top);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,&top);
      remove_nodes(this,(vector<int,_std::allocator<int>_> *)&local_48);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      solve(&lose,this,max_priority + -1,prec_opo,prec_cur,reached_bottom_opo,reached_bottom_cur);
      *num_nodes_in_h = this->cur_num_nodes;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,&top);
      restore_nodes(this,(vector<int,_std::allocator<int>_> *)&local_60);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
      bVar1 = get_attractor(this,(max_priority + -1) % 2,&lose);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_78,&lose);
      remove_nodes(this,(vector<int,_std::allocator<int>_> *)&local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lose.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&top.super__Vector_base<int,_std::allocator<int>_>);
      return bVar1;
    }
    *reached_bottom_opo = true;
  }
  return false;
}

Assistant:

bool ZLKPPSolver::do_step(int max_priority, int prec_cur, int prec_opo, int &num_nodes_in_h, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    num_nodes_in_h = INT_MAX;
    if (!cur_num_nodes)
        return false;
    if (prec_opo < min_dominion) {
        reached_bottom_opo = true;
        return false;
    }
    ++iterations;
    assert(cur_num_nodes); // we assume that the current game is nonempty
    auto top = get_nodes_of_max_priority(max_priority);
    get_attractor(max_priority % 2, top);
    remove_nodes(top);
    auto lose = solve(max_priority - 1, prec_opo, prec_cur, reached_bottom_opo, reached_bottom_cur);
    num_nodes_in_h = cur_num_nodes;
    restore_nodes(top);
    bool changed = get_attractor((max_priority - 1) % 2, lose);
    remove_nodes(lose);
    return changed;
}